

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name)

{
  _Rb_tree_header *p_Var1;
  pointer file;
  bool bVar2;
  Type TVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  DescriptorBuilder *pDVar6;
  _Base_ptr p_Var7;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar9;
  Symbol SVar10;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar8;
  
  SVar10 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name);
  aVar8 = SVar10.field_1;
  TVar3 = SVar10.type;
  if (TVar3 == NULL_SYMBOL) {
    TVar3 = NULL_SYMBOL;
  }
  else if (this->pool_->enforce_dependencies_ == true) {
    this_00 = (DescriptorBuilder *)(ulong)TVar3;
    pFVar4 = anon_unknown_1::Symbol::GetFile((Symbol *)this_00);
    if (pFVar4 != this->file_) {
      p_Var5 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      if (p_Var5 != (_Base_ptr)0x0) {
        do {
          if (*(FileDescriptor **)(p_Var5 + 1) >= pFVar4) {
            p_Var7 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[*(FileDescriptor **)(p_Var5 + 1) < pFVar4];
        } while (p_Var5 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(FileDescriptor **)(p_Var7 + 1) <= pFVar4))
        goto LAB_001dd26b;
      }
      if (TVar3 == PACKAGE) {
        bVar2 = IsInPackage(this_00,this->file_,name);
        TVar3 = PACKAGE;
        if (bVar2) goto LAB_001dd26b;
        pDVar6 = (DescriptorBuilder *)
                 (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (pDVar9 = pDVar6, pDVar9 != (DescriptorBuilder *)p_Var1) {
          file = (pDVar9->options_to_interpret_).
                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if ((file != (pointer)0x0) &&
             (bVar2 = IsInPackage(this_00,(FileDescriptor *)file,name), bVar2)) goto LAB_001dd26b;
          pDVar6 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar9);
          this_00 = pDVar9;
        }
      }
      this->possible_undeclared_dependency_ = pFVar4;
      std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
      aVar8 = DAT_002925f8;
      TVar3 = (anonymous_namespace)::kNullSymbol;
    }
  }
LAB_001dd26b:
  SVar10._4_4_ = 0;
  SVar10.type = TVar3;
  SVar10.field_1.descriptor = aVar8.descriptor;
  return SVar10;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name) {
  Symbol result = FindSymbolNotEnforcingDeps(name);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader.
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) return result;

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (set<const FileDescriptor*>::const_iterator it = dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}